

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O2

void __thiscall
booster::intrusive_ptr<booster::refcounted>::~intrusive_ptr
          (intrusive_ptr<booster::refcounted> *this)

{
  if (*(refcounted **)this != (refcounted *)0x0) {
    intrusive_ptr_release(*(refcounted **)this);
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }